

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O1

PmError Pm_Close(PortMidiStream *stream)

{
  int iVar1;
  PmError PVar2;
  bool bVar3;
  
  pm_hosterror = 0;
  PVar2 = pmBadPtr;
  if (stream == (PortMidiStream *)0x0) {
    bVar3 = false;
  }
  else {
    iVar1 = *stream;
    bVar3 = false;
    if ((-1 < (long)iVar1) && (iVar1 < pm_descriptor_index)) {
      bVar3 = descriptors[iVar1].pub.opened != 0;
      PVar2 = pmBadPtr;
      if (bVar3) {
        PVar2 = pmNoData;
      }
    }
  }
  if (bVar3) {
    PVar2 = (**(code **)(*(long *)((long)stream + 0x50) + 0x48))(stream);
    iVar1 = *stream;
    descriptors[iVar1].internalDescriptor = (void *)0x0;
    descriptors[iVar1].pub.opened = 0;
    if (*(PmQueue **)((long)stream + 0x20) != (PmQueue *)0x0) {
      Pm_QueueDestroy(*(PmQueue **)((long)stream + 0x20));
    }
    pm_free(stream);
  }
  return PVar2;
}

Assistant:

PMEXPORT PmError Pm_Close( PortMidiStream *stream ) {
    PmInternal *midi = (PmInternal *) stream;
    PmError err = pmNoError;

    pm_hosterror = FALSE;
    /* arg checking */
    if (midi == NULL) /* midi must point to something */
        err = pmBadPtr;
    /* if it is an open device, the device_id will be valid */
    else if (midi->device_id < 0 || midi->device_id >= pm_descriptor_index)
        err = pmBadPtr;
    /* and the device should be in the opened state */
    else if (!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    
    if (err != pmNoError) 
        goto error_return;

    /* close the device */
    err = (*midi->dictionary->close)(midi);
    /* even if an error occurred, continue with cleanup */
    descriptors[midi->device_id].internalDescriptor = NULL;
    descriptors[midi->device_id].pub.opened = FALSE;
    if (midi->queue) Pm_QueueDestroy(midi->queue);
    pm_free(midi); 
error_return:
    /* system dependent code must set pm_hosterror and
     * pm_hosterror_text if a pmHostError occurs.
     */
    return pm_errmsg(err);
}